

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

void getFileNames(string *path,
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *files)

{
  int iVar1;
  char *__name;
  ostream *this;
  value_type *in_RSI;
  string filename;
  dirent *ptr;
  DIR *pDir;
  value_type *__x;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__rhs;
  allocator *__lhs;
  string local_98 [8];
  char *in_stack_ffffffffffffff70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff78;
  string local_78 [55];
  allocator local_41;
  string local_40 [32];
  dirent *local_20;
  DIR *local_18;
  value_type *local_10;
  
  local_10 = in_RSI;
  __name = (char *)std::__cxx11::string::c_str();
  local_18 = opendir(__name);
  if (local_18 != (DIR *)0x0) {
    while (local_20 = readdir(local_18), local_20 != (dirent *)0x0) {
      iVar1 = strcmp(local_20->d_name,".");
      if ((iVar1 != 0) && (iVar1 = strcmp(local_20->d_name,".."), iVar1 != 0)) {
        __rhs = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_20->d_name;
        __lhs = &local_41;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_40,(char *)__rhs,__lhs);
        std::allocator<char>::~allocator((allocator<char> *)&local_41);
        __x = local_10;
        std::operator+(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(__rhs,__x);
        std::__cxx11::string::~string(local_78);
        std::__cxx11::string::~string(local_98);
        std::__cxx11::string::~string(local_40);
      }
    }
    return;
  }
  this = std::operator<<((ostream *)&std::cout,"Folder doesn\'t Exist!");
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  exit(-1);
}

Assistant:

void getFileNames(std::string path, std::vector<std::string>& files)
{
	DIR* pDir;
	struct dirent* ptr;
	if (!(pDir = opendir(path.c_str()))) {
		std::cout << "Folder doesn't Exist!" << std::endl;
		exit(-1);
	}
	while ((ptr = readdir(pDir)) != 0) {
		if (strcmp(ptr->d_name, ".") != 0 && strcmp(ptr->d_name, "..") != 0) {
			std::string filename(ptr->d_name);
			files.push_back(path + "/" + filename);
		}
	}
}